

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsl_optimizer.cpp
# Opt level: O1

void glslopt_shader_get_uniform_desc
               (glslopt_shader *shader,int index,char **outName,glslopt_basic_type *outType,
               glslopt_precision *outPrec,int *outVecSize,int *outMatSize,int *outArraySize,
               int *outLocation)

{
  *outName = shader->uniforms[index].name;
  *outType = shader->uniforms[index].type;
  *outPrec = shader->uniforms[index].prec;
  *outVecSize = shader->uniforms[index].vectorSize;
  *outMatSize = shader->uniforms[index].matrixSize;
  *outArraySize = shader->uniforms[index].arraySize;
  *outLocation = shader->uniforms[index].location;
  return;
}

Assistant:

void glslopt_shader_get_uniform_desc (glslopt_shader* shader, int index, const char** outName, glslopt_basic_type* outType, glslopt_precision* outPrec, int* outVecSize, int* outMatSize, int* outArraySize, int* outLocation)
{
	const glslopt_shader_var& v = shader->uniforms[index];
	*outName = v.name;
	*outType = v.type;
	*outPrec = v.prec;
	*outVecSize = v.vectorSize;
	*outMatSize = v.matrixSize;
	*outArraySize = v.arraySize;
	*outLocation = v.location;
}